

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::
stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
::destroy(stack_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator>
          *this)

{
  long lVar1;
  new_allocator<std::aligned_storage<32UL,_8UL>::type> *in_RDI;
  type *in_stack_ffffffffffffffe8;
  
  while (*(long *)(in_RDI + 8) != *(long *)in_RDI) {
    lVar1 = *(long *)(in_RDI + 8);
    *(string **)(in_RDI + 8) = (string *)(lVar1 + -0x20);
    std::__cxx11::string::~string((string *)(lVar1 + -0x20));
  }
  __gnu_cxx::new_allocator<std::aligned_storage<32UL,_8UL>::type>::deallocate
            (in_RDI,in_stack_ffffffffffffffe8,0x134862);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}